

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O0

void __thiscall Board::Board(Board *this,int size)

{
  reference this_00;
  Cell local_80;
  int local_68;
  int j;
  vector<Cell,_std::allocator<Cell>_> local_58;
  int local_34;
  undefined1 local_30 [4];
  int i;
  int local_14;
  Board *pBStack_10;
  int size_local;
  Board *this_local;
  
  this->size = size;
  local_14 = size;
  pBStack_10 = this;
  std::
  vector<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
  ::vector(&this->table);
  this->occupiedCells = 0;
  memset(local_30,0,0x18);
  std::
  vector<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
  ::vector((vector<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
            *)local_30);
  std::
  vector<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
  ::operator=(&this->table,
              (vector<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
               *)local_30);
  std::
  vector<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
  ::~vector((vector<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
             *)local_30);
  for (local_34 = 0; local_34 < local_14; local_34 = local_34 + 1) {
    local_58.super__Vector_base<Cell,_std::allocator<Cell>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_58.super__Vector_base<Cell,_std::allocator<Cell>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_58.super__Vector_base<Cell,_std::allocator<Cell>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<Cell,_std::allocator<Cell>_>::vector(&local_58);
    std::
    vector<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
    ::push_back(&this->table,&local_58);
    std::vector<Cell,_std::allocator<Cell>_>::~vector(&local_58);
    for (local_68 = 0; local_68 < local_14; local_68 = local_68 + 1) {
      this_00 = std::
                vector<std::vector<Cell,_std::allocator<Cell>_>,_std::allocator<std::vector<Cell,_std::allocator<Cell>_>_>_>
                ::operator[](&this->table,(long)local_34);
      Cell::Cell(&local_80,local_34,local_68);
      std::vector<Cell,_std::allocator<Cell>_>::push_back(this_00,&local_80);
      Cell::~Cell(&local_80);
    }
  }
  return;
}

Assistant:

Board::Board(int size)
    :size(size), occupiedCells(0){

    table = vector< vector<Cell> >();

    for (int i=0; i<size; i++){
        table.push_back(vector<Cell>());
        for (int j=0; j<size; j++){
            table[i].push_back( Cell(i,j) );
        }
    }
}